

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::SparsityStructure::~SparsityStructure(SparsityStructure *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x3ab104);
  return;
}

Assistant:

iDynTree::optimalcontrol::SparsityStructure::~SparsityStructure()
{ }